

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall
inject::not_providing::not_providing
          (not_providing *this,unique_id bound_component_id,unique_id interface_id)

{
  ostream *poVar1;
  stringstream oss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  *(undefined ***)this = &PTR__not_providing_00112ce8;
  this->_bound_id = bound_component_id;
  this->_interface_id = interface_id;
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  (this->_msg)._M_string_length = 0;
  (this->_msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"component ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," is bound as implementing component ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," but isn\'t registered as providing it");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

not_providing(
            unique_id bound_component_id,
            unique_id interface_id) throw() :
            exception(),
            _bound_id(bound_component_id),
            _interface_id(interface_id) {
        std::stringstream oss;
        oss <<
            "component " << bound_component_id <<
            " is bound as implementing component " << interface_id <<
            " but isn't registered as providing it";
        _msg = oss.str();
    }